

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManCleanMarks(If_DsdMan_t *p,int fVerbose)

{
  uint *puVar1;
  long lVar2;
  Vec_Wrd_t *__ptr;
  
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  __ptr = p->vConfigs;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      p->vConfigs->pArray = (word *)0x0;
      __ptr = p->vConfigs;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_003a35a8;
    }
    free(__ptr);
    p->vConfigs = (Vec_Wrd_t *)0x0;
  }
LAB_003a35a8:
  if (0 < (p->vObjs).nSize) {
    lVar2 = 0;
    do {
      puVar1 = (uint *)((long)(p->vObjs).pArray[lVar2] + 4);
      *puVar1 = *puVar1 & 0xfffffeff;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vObjs).nSize);
  }
  return;
}

Assistant:

void If_DsdManCleanMarks( If_DsdMan_t * p, int fVerbose )
{
    If_DsdObj_t * pObj; 
    int i;
    ABC_FREE( p->pCellStr );
    Vec_WrdFreeP( &p->vConfigs );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        pObj->fMark = 0;
}